

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pedersen_commitment_parse
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *input)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  secp256k1_fe x;
  secp256k1_ge ge;
  
  bVar1 = *input;
  iVar3 = 0;
  if ((bVar1 & 0xfe) == 8) {
    iVar2 = secp256k1_fe_set_b32(&x,input + 1);
    if (iVar2 != 0) {
      iVar2 = secp256k1_ge_set_xquad(&ge,&x);
      iVar3 = 0;
      if (iVar2 != 0) {
        if ((bVar1 & 1) != 0) {
          secp256k1_ge_neg(&ge,&ge);
        }
        secp256k1_pedersen_commitment_save(commit,&ge);
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int secp256k1_pedersen_commitment_parse(const secp256k1_context* ctx, secp256k1_pedersen_commitment* commit, const unsigned char *input) {
    secp256k1_fe x;
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(input != NULL);
    (void) ctx;

    if ((input[0] & 0xFE) != 8 ||
        !secp256k1_fe_set_b32(&x, &input[1]) ||
        !secp256k1_ge_set_xquad(&ge, &x)) {
        return 0;
    }
    if (input[0] & 1) {
        secp256k1_ge_neg(&ge, &ge);
    }
    secp256k1_pedersen_commitment_save(commit, &ge);
    return 1;
}